

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_sbcd_8_rr(void)

{
  uint *puVar1;
  uint uVar2;
  uint local_1c;
  uint res;
  uint dst;
  uint src;
  uint *r_dst;
  
  puVar1 = m68ki_cpu.dar + (m68ki_cpu.ir >> 9 & 7);
  local_1c = ((*puVar1 & 0xf) - (m68ki_cpu.dar[m68ki_cpu.ir & 7] & 0xf)) -
             (m68ki_cpu.x_flag >> 8 & 1);
  uVar2 = local_1c ^ 0xffffffff;
  if (9 < local_1c) {
    local_1c = local_1c - 6;
  }
  local_1c = ((*puVar1 & 0xf0) - (m68ki_cpu.dar[m68ki_cpu.ir & 7] & 0xf0)) + local_1c;
  m68ki_cpu.x_flag = (uint)(0x99 < local_1c) << 8;
  if (0x99 < local_1c != 0) {
    local_1c = local_1c + 0xa0;
  }
  m68ki_cpu.n_flag = local_1c & 0xff;
  m68ki_cpu.v_flag = m68ki_cpu.n_flag & uVar2;
  m68ki_cpu.not_z_flag = m68ki_cpu.n_flag | m68ki_cpu.not_z_flag;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  *puVar1 = *puVar1 & 0xffffff00 | m68ki_cpu.n_flag;
  return;
}

Assistant:

static void m68k_op_sbcd_8_rr(void)
{
	uint* r_dst = &DX;
	uint src = DY;
	uint dst = *r_dst;
	uint res = LOW_NIBBLE(dst) - LOW_NIBBLE(src) - XFLAG_AS_1();

	FLAG_V = ~res; /* Undefined V behavior */

	if(res > 9)
		res -= 6;
	res += HIGH_NIBBLE(dst) - HIGH_NIBBLE(src);
	FLAG_X = FLAG_C = (res > 0x99) << 8;
	if(FLAG_C)
		res += 0xa0;

	res = MASK_OUT_ABOVE_8(res);

	FLAG_V &= res; /* Undefined V behavior part II */
	FLAG_N = NFLAG_8(res); /* Undefined N behavior */
	FLAG_Z |= res;

	*r_dst = MASK_OUT_BELOW_8(*r_dst) | res;
}